

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

char * uv__strndup(char *s,size_t n)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(s);
  if (sVar1 < n) {
    n = sVar1;
  }
  if (n != 0xffffffffffffffff) {
    __dest = (void *)(*(code *)uv__allocator_0)();
    if (__dest != (void *)0x0) {
      *(undefined1 *)((long)__dest + n) = 0;
      pcVar2 = (char *)memcpy(__dest,s,n);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char* uv__strndup(const char* s, size_t n) {
  char* m;
  size_t len = strlen(s);
  if (n < len)
    len = n;
  m = uv__malloc(len + 1);
  if (m == NULL)
    return NULL;
  m[len] = '\0';
  return memcpy(m, s, len);
}